

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

Maybe<kj::Own<capnp::SchemaFile>_> __thiscall
capnp::SchemaFile::DiskSchemaFile::import(DiskSchemaFile *this,StringPtr target)

{
  long *plVar1;
  ReadableDirectory *pRVar2;
  ReadableFile *params;
  bool bVar3;
  ReadableDirectory **ppRVar4;
  Own<const_kj::ReadableFile> *pOVar5;
  Own<const_kj::ReadableFile> *pOVar6;
  Path *pPVar7;
  Maybe<kj::String> *params_4;
  char *in_RCX;
  SchemaFile *extraout_RDX;
  Type *func;
  SchemaFile *extraout_RDX_00;
  SchemaFile *pSVar8;
  char *pcVar9;
  StringPtr SVar10;
  Maybe<kj::Own<capnp::SchemaFile>_> MVar11;
  Own<capnp::SchemaFile::DiskSchemaFile> local_310;
  Own<capnp::SchemaFile> local_300;
  PathPtr local_2f0;
  Maybe<kj::Own<const_kj::ReadableFile>_> local_2e0;
  undefined1 local_2d0 [8];
  OwnOwn<const_kj::ReadableFile> newFile_1;
  Maybe<kj::Exception> local_2a8;
  undefined1 local_148 [8];
  Maybe<kj::String> displayNameOverride;
  ArrayPtr<const_kj::String> local_118;
  undefined1 local_108 [8];
  Path parsed_1;
  void *local_e8;
  Own<capnp::SchemaFile::DiskSchemaFile> local_e0;
  Own<capnp::SchemaFile> local_d0;
  PathPtr local_c0;
  Maybe<kj::Own<const_kj::ReadableFile>_> local_b0;
  undefined1 local_a0 [8];
  OwnOwn<const_kj::ReadableFile> newFile;
  ReadableDirectory *candidate;
  ReadableDirectory **__end3;
  ReadableDirectory **local_70;
  ReadableDirectory **__begin3;
  ArrayPtr<const_kj::ReadableDirectory_*const> *__range3;
  undefined1 local_50 [8];
  Path parsed;
  DiskSchemaFile *this_local;
  StringPtr target_local;
  
  this_local = (DiskSchemaFile *)target.content.size_;
  pcVar9 = target.content.ptr;
  target_local.content.ptr = in_RCX;
  target_local.content.size_ = (size_t)this;
  kj::StringPtr::StringPtr((StringPtr *)&parsed.parts.disposer,"/");
  bVar3 = kj::StringPtr::startsWith((StringPtr *)&this_local,(StringPtr *)&parsed.parts.disposer);
  if (bVar3) {
    SVar10 = kj::StringPtr::slice((StringPtr *)&this_local,1);
    kj::Path::parse((Path *)local_50,SVar10);
    local_70 = kj::ArrayPtr<const_kj::ReadableDirectory_*const>::begin
                         ((ArrayPtr<const_kj::ReadableDirectory_*const> *)(pcVar9 + 0x28));
    ppRVar4 = kj::ArrayPtr<const_kj::ReadableDirectory_*const>::end
                        ((ArrayPtr<const_kj::ReadableDirectory_*const> *)(pcVar9 + 0x28));
    for (; local_70 != ppRVar4; local_70 = local_70 + 1) {
      pRVar2 = *local_70;
      newFile.value.ptr = (ReadableFile *)pRVar2;
      kj::PathPtr::PathPtr(&local_c0,(Path *)local_50);
      (*(pRVar2->super_FsNode)._vptr_FsNode[10])
                (&local_b0,pRVar2,local_c0.parts.ptr,local_c0.parts.size_);
      kj::_::readMaybe<kj::ReadableFile_const>((_ *)local_a0,&local_b0);
      kj::Maybe<kj::Own<const_kj::ReadableFile>_>::~Maybe(&local_b0);
      pOVar6 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_a0);
      params = newFile.value.ptr;
      if (pOVar6 != (Own<const_kj::ReadableFile> *)0x0) {
        pPVar7 = kj::mv<kj::Path>((Path *)local_50);
        pOVar5 = kj::_::OwnOwn<const_kj::ReadableFile>::operator*
                           ((OwnOwn<const_kj::ReadableFile> *)local_a0);
        pOVar5 = kj::mv<kj::Own<kj::ReadableFile_const>>(pOVar5);
        local_e8 = (void *)0x0;
        kj::
        heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>const&,kj::Own<kj::ReadableFile_const>,decltype(nullptr)>
                  ((kj *)&local_e0,(ReadableDirectory *)params,pPVar7,
                   (ArrayPtr<const_kj::ReadableDirectory_*const> *)(pcVar9 + 0x28),pOVar5,&local_e8)
        ;
        kj::implicitCast<kj::Own<capnp::SchemaFile>,kj::Own<capnp::SchemaFile::DiskSchemaFile>>
                  ((kj *)&local_d0,&local_e0);
        kj::Maybe<kj::Own<capnp::SchemaFile>_>::Maybe
                  ((Maybe<kj::Own<capnp::SchemaFile>_> *)this,&local_d0);
        kj::Own<capnp::SchemaFile>::~Own(&local_d0);
        kj::Own<capnp::SchemaFile::DiskSchemaFile>::~Own(&local_e0);
      }
      parsed_1.parts.disposer._5_3_ = 0;
      parsed_1.parts.disposer._4_1_ = pOVar6 != (Own<const_kj::ReadableFile> *)0x0;
      kj::_::OwnOwn<const_kj::ReadableFile>::~OwnOwn((OwnOwn<const_kj::ReadableFile> *)local_a0);
      if (parsed_1.parts.disposer._4_4_ != 0) goto LAB_0088f427;
    }
    kj::Maybe<kj::Own<capnp::SchemaFile>_>::Maybe
              ((Maybe<kj::Own<capnp::SchemaFile>_> *)this,(void *)0x0);
    parsed_1.parts.disposer._4_4_ = 1;
LAB_0088f427:
    kj::Path::~Path((Path *)local_50);
    pSVar8 = extraout_RDX;
  }
  else {
    local_118 = (ArrayPtr<const_kj::String>)kj::Path::parent((Path *)(pcVar9 + 0x10));
    displayNameOverride.ptr.field_1.value.content.disposer = (ArrayDisposer *)this_local;
    SVar10.content.size_ = (size_t)target_local.content.ptr;
    SVar10.content.ptr = (char *)this_local;
    kj::PathPtr::eval((Path *)local_108,(PathPtr *)&local_118,SVar10);
    kj::Maybe<kj::String>::Maybe((Maybe<kj::String> *)local_148);
    if ((pcVar9[0x60] & 1U) != 0) {
      newFile_1.value.ptr = (ReadableFile *)local_148;
      kj::
      runCatchingExceptions<capnp::SchemaFile::DiskSchemaFile::import(kj::StringPtr)const::_lambda()_1_>
                (&local_2a8,(kj *)&newFile_1.value.ptr,func);
      kj::Maybe<kj::Exception>::~Maybe(&local_2a8);
    }
    plVar1 = *(long **)(pcVar9 + 8);
    kj::PathPtr::PathPtr(&local_2f0,(Path *)local_108);
    (**(code **)(*plVar1 + 0x50))(&local_2e0,plVar1,local_2f0.parts.ptr,local_2f0.parts.size_);
    kj::_::readMaybe<kj::ReadableFile_const>((_ *)local_2d0,&local_2e0);
    kj::Maybe<kj::Own<const_kj::ReadableFile>_>::~Maybe(&local_2e0);
    pOVar6 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_2d0);
    if (pOVar6 == (Own<const_kj::ReadableFile> *)0x0) {
      kj::Maybe<kj::Own<capnp::SchemaFile>_>::Maybe
                ((Maybe<kj::Own<capnp::SchemaFile>_> *)this,(void *)0x0);
    }
    else {
      pRVar2 = *(ReadableDirectory **)(pcVar9 + 8);
      pPVar7 = kj::mv<kj::Path>((Path *)local_108);
      pOVar6 = kj::_::OwnOwn<const_kj::ReadableFile>::operator*
                         ((OwnOwn<const_kj::ReadableFile> *)local_2d0);
      pOVar6 = kj::mv<kj::Own<kj::ReadableFile_const>>(pOVar6);
      params_4 = kj::mv<kj::Maybe<kj::String>>((Maybe<kj::String> *)local_148);
      kj::
      heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>const&,kj::Own<kj::ReadableFile_const>,kj::Maybe<kj::String>>
                ((kj *)&local_310,pRVar2,pPVar7,
                 (ArrayPtr<const_kj::ReadableDirectory_*const> *)(pcVar9 + 0x28),pOVar6,params_4);
      kj::implicitCast<kj::Own<capnp::SchemaFile>,kj::Own<capnp::SchemaFile::DiskSchemaFile>>
                ((kj *)&local_300,&local_310);
      kj::Maybe<kj::Own<capnp::SchemaFile>_>::Maybe
                ((Maybe<kj::Own<capnp::SchemaFile>_> *)this,&local_300);
      kj::Own<capnp::SchemaFile>::~Own(&local_300);
      kj::Own<capnp::SchemaFile::DiskSchemaFile>::~Own(&local_310);
    }
    parsed_1.parts.disposer._4_4_ = 1;
    kj::_::OwnOwn<const_kj::ReadableFile>::~OwnOwn((OwnOwn<const_kj::ReadableFile> *)local_2d0);
    kj::Maybe<kj::String>::~Maybe((Maybe<kj::String> *)local_148);
    kj::Path::~Path((Path *)local_108);
    pSVar8 = extraout_RDX_00;
  }
  MVar11.ptr.ptr = pSVar8;
  MVar11.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::SchemaFile>_>)MVar11.ptr;
}

Assistant:

kj::Maybe<kj::Own<SchemaFile>> import(kj::StringPtr target) const override {
    if (target.startsWith("/")) {
      auto parsed = kj::Path::parse(target.slice(1));
      for (auto candidate: importPath) {
        KJ_IF_MAYBE(newFile, candidate->tryOpenFile(parsed)) {
          return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
              *candidate, kj::mv(parsed), importPath, kj::mv(*newFile), nullptr));
        }
      }
      return nullptr;
    } else {
      auto parsed = path.parent().eval(target);

      kj::Maybe<kj::String> displayNameOverride;
      if (displayNameOverridden) {
        // Try to create a consistent display name override for the imported file. This is for
        // backwards-compatibility only -- display names are only overridden when using the
        // deprecated parseDiskFile() interface.
        kj::runCatchingExceptions([&]() {
          displayNameOverride = kj::Path::parse(displayName).parent().eval(target).toString();
        });
      }

      KJ_IF_MAYBE(newFile, baseDir.tryOpenFile(parsed)) {
        return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
            baseDir, kj::mv(parsed), importPath, kj::mv(*newFile), kj::mv(displayNameOverride)));
      } else {
        return nullptr;
      }
    }
  }